

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderPrecisionTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::ShaderIntPrecisionCase::ShaderIntPrecisionCase
          (ShaderIntPrecisionCase *this,Context *context,char *name,char *desc,char *op,
          EvalFunc evalFunc,Precision precision,int bits,IVec2 *rangeA,IVec2 *rangeB,
          bool isVertexCase)

{
  deUint32 seed;
  allocator<char> local_31;
  
  gles3::TestCase::TestCase(&this->super_TestCase,context,name,desc);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderIntPrecisionCase_01e2c6e8;
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_op,op,&local_31);
  this->m_evalFunc = evalFunc;
  this->m_precision = precision;
  this->m_bits = bits;
  tcu::Vector<int,_2>::Vector(&this->m_rangeA,rangeA);
  tcu::Vector<int,_2>::Vector(&this->m_rangeB,rangeB);
  this->m_isVertexCase = isVertexCase;
  this->m_numTestsPerIter = 0x20;
  this->m_numIters = 4;
  seed = deStringHash(name);
  deRandom_init(&(this->m_rnd).m_rnd,seed);
  this->m_program = (ShaderProgram *)0x0;
  this->m_framebuffer = 0;
  this->m_renderbuffer = 0;
  this->m_iterNdx = 0;
  return;
}

Assistant:

ShaderIntPrecisionCase::ShaderIntPrecisionCase (Context& context, const char* name, const char* desc, const char* op, EvalFunc evalFunc, glu::Precision precision, int bits, const tcu::IVec2& rangeA, const tcu::IVec2& rangeB, bool isVertexCase)
	: TestCase			(context, name, desc)
	, m_op				(op)
	, m_evalFunc		(evalFunc)
	, m_precision		(precision)
	, m_bits			(bits)
	, m_rangeA			(rangeA)
	, m_rangeB			(rangeB)
	, m_isVertexCase	(isVertexCase)
	, m_numTestsPerIter	(32)
	, m_numIters		(4)
	, m_rnd				(deStringHash(name))
	, m_program			(DE_NULL)
	, m_framebuffer		(0)
	, m_renderbuffer	(0)
	, m_iterNdx			(0)
{
}